

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_MeshCache::Internal_CopyHelper(ON_MeshCache *this,ON_MeshCacheItem *src_impl)

{
  ON_MeshCacheItem *pOVar1;
  ON_MeshCacheItem *item_copy;
  ON_MeshCacheItem *src_item;
  ON_MeshCacheItem *prev;
  ON_MeshCacheItem *src_impl_local;
  ON_MeshCache *this_local;
  
  this->m_impl = (ON_MeshCacheItem *)0x0;
  src_item = (ON_MeshCacheItem *)0x0;
  for (item_copy = src_impl; item_copy != (ON_MeshCacheItem *)0x0; item_copy = item_copy->m_next) {
    pOVar1 = Internal_CopyItem(this,item_copy);
    if (src_item == (ON_MeshCacheItem *)0x0) {
      this->m_impl = pOVar1;
    }
    else {
      src_item->m_next = pOVar1;
    }
    src_item = pOVar1;
  }
  return;
}

Assistant:

void ON_MeshCache::Internal_CopyHelper(
  const class ON_MeshCacheItem* src_impl
  )
{
  m_impl = 0;
  ON_MeshCacheItem* prev = nullptr;
  for (const ON_MeshCacheItem* src_item = src_impl; nullptr != src_item; src_item = src_item->m_next)
  {
    ON_MeshCacheItem* item_copy = Internal_CopyItem(*src_item);
    if (nullptr == prev)
      m_impl = item_copy;
    else
      prev->m_next = item_copy;
    prev = item_copy;
  }
}